

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsPlanetary.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsPlanetary::ChShaftsPlanetary(ChShaftsPlanetary *this,ChShaftsPlanetary *other)

{
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsPlanetary_00b4aa00;
  (this->super_ChPhysicsItem).field_0x74 = 1;
  ChConstraintThreeGeneric::ChConstraintThreeGeneric(&this->constraint);
  this->r1 = other->r1;
  this->r2 = other->r2;
  this->r3 = other->r3;
  this->torque_react = other->torque_react;
  this->shaft1 = (ChShaft *)SUB168(ZEXT816(0) << 0x20,0);
  this->shaft2 = (ChShaft *)SUB168(ZEXT816(0) << 0x20,8);
  this->shaft3 = (ChShaft *)0x0;
  this->avoid_phase_drift = other->avoid_phase_drift;
  this->phase1 = other->phase1;
  this->phase2 = other->phase2;
  this->phase3 = other->phase3;
  return;
}

Assistant:

ChShaftsPlanetary::ChShaftsPlanetary(const ChShaftsPlanetary& other) : ChPhysicsItem(other), active(true) {
    r1 = other.r1;
    r2 = other.r2;
    r3 = other.r3;

    torque_react = other.torque_react;
    shaft1 = NULL;
    shaft2 = NULL;
    shaft3 = NULL;

    avoid_phase_drift = other.avoid_phase_drift;
    phase1 = other.phase1;
    phase2 = other.phase2;
    phase3 = other.phase3;
}